

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O0

void __thiscall
pstore::region::file_based_factory::add
          (file_based_factory *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  shared_ptr<pstore::file::file_handle> local_38;
  uint64_t local_28;
  uint64_t new_size_local;
  uint64_t original_size_local;
  file_based_factory *this_local;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  regions_local;
  
  local_28 = new_size;
  new_size_local = original_size;
  original_size_local = (uint64_t)this;
  this_local = (file_based_factory *)regions.ptr_;
  std::shared_ptr<pstore::file::file_handle>::shared_ptr(&local_38,&this->file_);
  factory::append<pstore::file::file_handle,pstore::memory_mapper>
            (&this->super_factory,&local_38,
             (not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
              )this_local,new_size_local,local_28);
  std::shared_ptr<pstore::file::file_handle>::~shared_ptr(&local_38);
  return;
}

Assistant:

void file_based_factory::add (gsl::not_null<std::vector<memory_mapper_ptr> *> const regions,
                                      std::uint64_t const original_size,
                                      std::uint64_t const new_size) {
            this->append<file::file_handle, memory_mapper> (file_, regions, original_size,
                                                            new_size);
        }